

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_copy_t::inc(data_copy_t *this)

{
  common_comparison_category_t<__detail::__synth3way_t<short>,___detail::__synth3way_t<unsigned_long>_>
  cVar1;
  
  this->index[this->smaller_one] = this->index[this->smaller_one] + 1;
  cVar1 = std::operator<=><short,unsigned_long>
                    (this->arr[0].
                     super__Vector_base<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->index[0],
                     this->arr[1].
                     super__Vector_base<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->index[1]);
  this->smaller_one = (uint)('\0' < cVar1._M_value);
  return;
}

Assistant:

void inc() {
      index[smaller_one]++;
      if (arr[0][index[0]] <= arr[1][index[1]]) {
        smaller_one = 0;
      }
      else {
        smaller_one = 1;
      }
    }